

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O0

void anon_unknown.dwarf_f6f6::AudioState::EventCallback
               (ALenum eventType,ALuint object,ALuint param,ALsizei length,ALchar *message,
               void *userParam)

{
  ostream *poVar1;
  void *this;
  undefined1 *puVar2;
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  int in_EDI;
  char *in_R8;
  void *in_R9;
  lock_guard<std::mutex> lock;
  AudioState *self;
  memory_order __b;
  mutex_type *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  allocator local_89;
  string local_88 [39];
  char local_61;
  int local_60;
  char local_59;
  int local_58;
  void *local_38;
  char *local_28;
  uint local_20;
  uint local_1c;
  uint local_18;
  int local_14;
  memory_order local_10;
  int local_c;
  undefined1 *local_8;
  
  if (in_EDI == 0x19a4) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               in_stack_fffffffffffffef8);
    std::unique_lock<std::mutex>::unlock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    std::condition_variable::notify_one();
  }
  else {
    local_38 = in_R9;
    local_28 = in_R8;
    local_20 = in_ECX;
    local_1c = in_EDX;
    local_18 = in_ESI;
    local_14 = in_EDI;
    poVar1 = std::operator<<((ostream *)&std::cout,"\n---- AL Event on AudioState ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_38);
    std::operator<<(poVar1," ----\nEvent: ");
    if (local_14 == 0x19a4) {
      std::operator<<((ostream *)&std::cout,"Buffer completed");
    }
    else if (local_14 == 0x19a5) {
      std::operator<<((ostream *)&std::cout,"Source state changed");
    }
    else if (local_14 == 0x19a6) {
      std::operator<<((ostream *)&std::cout,"Disconnected");
    }
    else {
      poVar1 = std::operator<<((ostream *)&std::cout,"0x");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
      local_58 = (int)std::setw(4);
      poVar1 = std::operator<<(poVar1,(_Setw)local_58);
      local_59 = (char)std::setfill<char>('0');
      poVar1 = std::operator<<(poVar1,local_59);
      this = (void *)std::ostream::operator<<(poVar1,local_14);
      poVar1 = (ostream *)std::ostream::operator<<(this,std::dec);
      local_60 = (int)std::setw(0);
      poVar1 = std::operator<<(poVar1,(_Setw)local_60);
      local_61 = (char)std::setfill<char>(' ');
      std::operator<<(poVar1,local_61);
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"\nObject ID: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    poVar1 = std::operator<<(poVar1,"\nParameter: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1c);
    poVar1 = std::operator<<(poVar1,"\nMessage: ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_88,local_28,(ulong)local_20,&local_89);
    poVar1 = std::operator<<(poVar1,local_88);
    poVar1 = std::operator<<(poVar1,"\n----");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_88);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    if (local_14 == 0x19a6) {
      std::lock_guard<std::mutex>::lock_guard
                ((lock_guard<std::mutex> *)
                 CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
      puVar2 = (undefined1 *)((long)local_38 + 0x1a0);
      local_c = 3;
      local_8 = puVar2;
      local_10 = std::operator&(memory_order_release,__memory_order_mask);
      if (local_c == 3) {
        *puVar2 = 0;
      }
      else if (local_c == 5) {
        LOCK();
        *puVar2 = 0;
        UNLOCK();
      }
      else {
        *puVar2 = 0;
      }
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x115791);
      std::condition_variable::notify_one();
    }
  }
  return;
}

Assistant:

void AL_APIENTRY AudioState::EventCallback(ALenum eventType, ALuint object, ALuint param,
    ALsizei length, const ALchar *message, void *userParam)
{
    auto self = static_cast<AudioState*>(userParam);

    if(eventType == AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT)
    {
        /* Temporarily lock the source mutex to ensure it's not between
         * checking the processed count and going to sleep.
         */
        std::unique_lock<std::mutex>{self->mSrcMutex}.unlock();
        self->mSrcCond.notify_one();
        return;
    }

    std::cout<< "\n---- AL Event on AudioState "<<self<<" ----\nEvent: ";
    switch(eventType)
    {
    case AL_EVENT_TYPE_BUFFER_COMPLETED_SOFT: std::cout<< "Buffer completed"; break;
    case AL_EVENT_TYPE_SOURCE_STATE_CHANGED_SOFT: std::cout<< "Source state changed"; break;
    case AL_EVENT_TYPE_DISCONNECTED_SOFT: std::cout<< "Disconnected"; break;
    default:
        std::cout<< "0x"<<std::hex<<std::setw(4)<<std::setfill('0')<<eventType<<std::dec<<
            std::setw(0)<<std::setfill(' '); break;
    }
    std::cout<< "\n"
        "Object ID: "<<object<<"\n"
        "Parameter: "<<param<<"\n"
        "Message: "<<std::string{message, static_cast<ALuint>(length)}<<"\n----"<<
        std::endl;

    if(eventType == AL_EVENT_TYPE_DISCONNECTED_SOFT)
    {
        {
            std::lock_guard<std::mutex> lock{self->mSrcMutex};
            self->mConnected.clear(std::memory_order_release);
        }
        self->mSrcCond.notify_one();
    }
}